

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_st_seg.c
# Opt level: O0

int agg_st_seg(model_def_t *mdef,lexicon_t *lex,feat_t *fcb,uint32 *ts2cb,int32 *cb2mllr,
              segdmp_type_t type)

{
  int iVar1;
  cmd_ln_t *cmdln;
  long lVar2;
  char *pcVar3;
  uint32 *local_b8;
  uint32 *local_b0;
  uint local_a4;
  int32 mfc_veclen;
  uint32 mcls;
  float32 ***b;
  float32 ****a;
  uint32 n_mllr_cls;
  uint32 *veclen_tmp;
  uint32 *veclen;
  uint local_68;
  uint32 n_stream_tmp;
  uint32 n_stream;
  uint32 t;
  uint32 j;
  uint32 i;
  uint32 *sseq;
  vector_t **feat;
  mfcc_t **ppmStack_40;
  int32 n_frame;
  vector_t *mfcc;
  uint32 seq_no;
  segdmp_type_t type_local;
  int32 *cb2mllr_local;
  uint32 *ts2cb_local;
  feat_t *fcb_local;
  lexicon_t *lex_local;
  model_def_t *mdef_local;
  
  ppmStack_40 = (mfcc_t **)0x0;
  sseq = (uint32 *)0x0;
  _j = (uint32 *)0x0;
  local_68 = 0;
  veclen_tmp = (uint32 *)0x0;
  b = (float32 ***)0x0;
  _mfc_veclen = (float32 ***)0x0;
  mfcc._4_4_ = type;
  _seq_no = cb2mllr;
  cb2mllr_local = (int32 *)ts2cb;
  ts2cb_local = (uint32 *)fcb;
  fcb_local = (feat_t *)lex;
  lex_local = (lexicon_t *)mdef;
  cmdln = cmd_ln_get();
  lVar2 = cmd_ln_int_r(cmdln,"-ceplen");
  if (ts2cb_local[9] == 0) {
    local_a4 = ts2cb_local[5];
  }
  else {
    local_a4 = ts2cb_local[9];
  }
  local_68 = local_a4;
  if (*(long *)(ts2cb_local + 0x20) == 0) {
    if (*(long *)(ts2cb_local + 10) == 0) {
      local_b8 = *(uint32 **)(ts2cb_local + 6);
    }
    else {
      local_b8 = *(uint32 **)(ts2cb_local + 10);
    }
    local_b0 = local_b8;
  }
  else {
    local_b0 = ts2cb_local + 0x23;
  }
  veclen_tmp = local_b0;
  mfcc._0_4_ = corpus_get_begin();
  while( true ) {
    iVar1 = corpus_next_utt();
    if (iVar1 == 0) {
      if (ppmStack_40 != (mfcc_t **)0x0) {
        free(*ppmStack_40);
        ckd_free(ppmStack_40);
        ppmStack_40 = (mfcc_t **)0x0;
      }
      if (sseq != (uint32 *)0x0) {
        feat_array_free((mfcc_t ***)sseq);
        sseq = (uint32 *)0x0;
      }
      if (_j != (uint32 *)0x0) {
        ckd_free(_j);
      }
      return 0;
    }
    if ((uint32)mfcc % 0xfa == 0) {
      err_msg(ERR_INFOCONT,(char *)0x0,0," [%u]",(ulong)(uint32)mfcc);
    }
    if (ppmStack_40 != (mfcc_t **)0x0) {
      free(*ppmStack_40);
      ckd_free(ppmStack_40);
      ppmStack_40 = (mfcc_t **)0x0;
    }
    iVar1 = corpus_get_generic_featurevec
                      ((vector_t **)&stack0xffffffffffffffc0,(int32 *)((long)&feat + 4),
                       (uint32)lVar2);
    if (iVar1 < 0) break;
    if (_j != (uint32 *)0x0) {
      ckd_free(_j);
      _j = (uint32 *)0x0;
    }
    _j = get_sseq((model_def_t *)lex_local,(lexicon_t *)fcb_local,feat._4_4_);
    if (_j == (uint32 *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
              ,0xb9,"senone sequence not produced; skipping.\n");
      free(*ppmStack_40);
      ckd_free(ppmStack_40);
      feat_array_free((mfcc_t ***)sseq);
    }
    else {
      if (sseq != (uint32 *)0x0) {
        feat_array_free((mfcc_t ***)sseq);
        sseq = (uint32 *)0x0;
      }
      if ((int)feat._4_4_ < 9) {
        pcVar3 = corpus_utt();
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
                ,200,"utt %s too short\n",pcVar3);
        if (ppmStack_40 != (mfcc_t **)0x0) {
          ckd_free(*ppmStack_40);
          ckd_free(ppmStack_40);
          ppmStack_40 = (mfcc_t **)0x0;
        }
      }
      else {
        sseq = (uint32 *)feat_array_alloc((feat_t *)ts2cb_local,feat._4_4_ + ts2cb_local[8]);
        feat_s2mfc2feat_live
                  ((feat_t *)ts2cb_local,ppmStack_40,(int32 *)((long)&feat + 4),1,1,(mfcc_t ***)sseq
                  );
        iVar1 = corpus_has_xfrm();
        if (iVar1 != 0) {
          if (b != (float32 ***)0x0) {
            for (t = 0; t < a._4_4_; t = t + 1) {
              for (n_stream = 0; n_stream < local_68; n_stream = n_stream + 1) {
                ckd_free_2d(b[t][n_stream]);
              }
            }
            ckd_free_2d(b);
          }
          if (_mfc_veclen != (float32 ***)0x0) {
            for (t = 0; t < a._4_4_; t = t + 1) {
              for (n_stream = 0; n_stream < local_68; n_stream = n_stream + 1) {
                ckd_free(_mfc_veclen[t][n_stream]);
              }
            }
          }
          corpus_get_xfrm((float32 *****)&b,(float32 ****)&mfc_veclen,
                          (uint32 **)&stack0xffffffffffffff80,(uint32 *)((long)&a + 4),
                          (uint32 *)((long)&veclen + 4));
          if (local_68 != veclen._4_4_) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
                    ,0xec,"Feature module # of streams, %u, is inconsistent w/ MLLR matrix, %u\n",
                    (ulong)local_68,(ulong)veclen._4_4_);
            exit(1);
          }
          for (t = 0; t < a._4_4_; t = t + 1) {
            for (n_stream = 0; n_stream < local_68; n_stream = n_stream + 1) {
              invert((float32 **)b[t][n_stream],(float32 **)b[t][n_stream],veclen_tmp[n_stream]);
            }
          }
        }
        for (n_stream_tmp = 0; n_stream_tmp < feat._4_4_; n_stream_tmp = n_stream_tmp + 1) {
          iVar1 = corpus_has_xfrm();
          if (iVar1 != 0) {
            xfrm_feat((float32 ***)b[(uint)_seq_no[(uint)cb2mllr_local[_j[n_stream_tmp]]]],
                      _mfc_veclen[(uint)_seq_no[(uint)cb2mllr_local[_j[n_stream_tmp]]]],
                      *(float32 ***)(sseq + (ulong)n_stream_tmp * 2),local_68,veclen_tmp);
          }
          segdmp_add_feat(_j[n_stream_tmp],(vector_t **)(sseq + (ulong)n_stream_tmp * 2),1);
        }
      }
    }
    mfcc._0_4_ = (uint32)mfcc + 1;
  }
  pcVar3 = corpus_utt();
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_st_seg.c"
          ,0xad,"Can\'t read input features from %s\n",pcVar3);
  exit(1);
}

Assistant:

int
agg_st_seg(model_def_t *mdef,
	   lexicon_t *lex,
	   feat_t* fcb,
	   uint32 *ts2cb,
	   int32 *cb2mllr,
	   segdmp_type_t type)
{
    uint32 seq_no;
    vector_t *mfcc = NULL;
    int32 n_frame;
    vector_t **feat = NULL;
    uint32 *sseq = NULL;
    uint32 i, j;
    uint32 t;
    uint32 n_stream=0;
    uint32 n_stream_tmp;
    uint32 *veclen = NULL;
    uint32 *veclen_tmp;
    uint32 n_mllr_cls;
    float32 ****a = NULL;
    float32 ***b = NULL;
    uint32 mcls;
    int32 mfc_veclen = cmd_ln_int32("-ceplen");

    n_stream = feat_dimension1(fcb);
    veclen = feat_stream_lengths(fcb);


    for (seq_no = corpus_get_begin(); corpus_next_utt(); seq_no++) {
	if (!(seq_no % 250)) {
	    E_INFOCONT(" [%u]", seq_no);
	}
	
	    if (mfcc) {
		free(mfcc[0]);
		ckd_free(mfcc);

		mfcc = NULL;
	    }

	    if (corpus_get_generic_featurevec(&mfcc, &n_frame, mfc_veclen) < 0) {
	      E_FATAL("Can't read input features from %s\n", corpus_utt());
	    }


	if (sseq != NULL) {
	    ckd_free((void *)sseq);
	    sseq = NULL;
	}

	/* read transcript and convert it into a senone sequence */
	sseq = get_sseq(mdef, lex, n_frame);
	if (sseq == NULL) {
	    E_WARN("senone sequence not produced; skipping.\n");

	    free(mfcc[0]);
	    ckd_free((void *)mfcc);
	    feat_array_free(feat);

	    continue;
	}
	
	    if (feat) {
		feat_array_free(feat);
		feat = NULL;
	    }

	    if (n_frame < 9) {
	      E_WARN("utt %s too short\n", corpus_utt());
	      if (mfcc) {
		ckd_free(mfcc[0]);
		ckd_free(mfcc);
		mfcc = NULL;
	      }
	      continue;
	    }

	    feat = feat_array_alloc(fcb, n_frame + feat_window_size(fcb));
	    feat_s2mfc2feat_live(fcb, mfcc, &n_frame, TRUE, TRUE, feat);

	    if (corpus_has_xfrm()) {
		if (a) {
		    for (i = 0; i < n_mllr_cls; i++) {
			for (j = 0; j < n_stream; j++) {
			    ckd_free_2d((void **)a[i][j]);
			}
		    }
		    ckd_free_2d((void **)a);
		}
		if (b) {
		    for (i = 0; i < n_mllr_cls; i++) {
			for (j = 0; j < n_stream; j++) {
			    ckd_free((void *)b[i][j]);
			}
		    }
		}

		corpus_get_xfrm(&a, &b,
				&veclen_tmp,
				&n_mllr_cls,
				&n_stream_tmp);

		if (n_stream != n_stream_tmp) {
		    E_FATAL("Feature module # of streams, %u, is inconsistent w/ MLLR matrix, %u\n",
			    n_stream, n_stream_tmp);
		}

		for (i = 0; i < n_mllr_cls; i++) {
		    for (j = 0; j < n_stream; j++) {
			invert(a[i][j], a[i][j], veclen[j]);
		    }
		}
	    }

	    for (t = 0; t < n_frame; t++) {
		if (corpus_has_xfrm()) {
		    /* determine the MLLR class for the frame */
		    mcls = cb2mllr[ts2cb[sseq[t]]];

		    /* Transform the feature space using the inverse MLLR transform */
		    xfrm_feat(a[mcls], b[mcls], feat[t], n_stream, veclen);
		}
		segdmp_add_feat(sseq[t], &feat[t], 1);
	    }
    }
    
    if (mfcc) {
	free(mfcc[0]);
	ckd_free(mfcc);
	
	mfcc = NULL;
    }

    if (feat) {
	feat_array_free(feat);
	feat = NULL;
    }

    if (sseq) {
	ckd_free((void *)sseq);
	sseq = NULL;
    }

    return S3_SUCCESS;
}